

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupDestinationRecord.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GroupDestinationRecord::Encode(GroupDestinationRecord *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  GroupDestinationRecord *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui32GrpBtField);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8DstPriority);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8LnStCmd);
  KDataStream::operator<<(pKVar1,this->m_ui16Padding1);
  return;
}

Assistant:

void GroupDestinationRecord::Encode( KDataStream & stream ) const
{
    stream << m_ui32GrpBtField
           << m_ui8DstPriority
           << m_ui8LnStCmd
           << m_ui16Padding1;
}